

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O0

void Genetic::clear(void)

{
  Solution *this;
  bool bVar1;
  reference ppVar2;
  pair<Solution_*,_double> solution;
  iterator __end1;
  iterator __begin1;
  list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_> *__range1;
  
  __end1 = std::__cxx11::
           list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::
           begin(&solutions_abi_cxx11_);
  solution.second =
       (double)std::__cxx11::
               list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
               ::end(&solutions_abi_cxx11_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&solution.second);
    if (!bVar1) break;
    ppVar2 = std::_List_iterator<std::pair<Solution_*,_double>_>::operator*(&__end1);
    this = ppVar2->first;
    solution.first = (Solution *)ppVar2->second;
    if (this != (Solution *)0x0) {
      Solution::~Solution(this);
      operator_delete(this);
    }
    std::_List_iterator<std::pair<Solution_*,_double>_>::operator++(&__end1);
  }
  std::__cxx11::list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
  ::clear(&solutions_abi_cxx11_);
  ticket_max = 0.0;
  max_weight = 0.0;
  return;
}

Assistant:

void Genetic::clear()
{
	for (auto solution : solutions)
	{
		delete solution.first;
	}
	solutions.clear();
	ticket_max = 0;
	max_weight = 0;
}